

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O1

bool anon_unknown.dwarf_101ce38::InitializeSymbolTable
               (TString *builtIns,int version,EProfile profile,SpvVersion *spvVersion,
               EShLanguage language,EShSource source,TInfoSink *infoSink,TSymbolTable *symbolTable)

{
  undefined8 *puVar1;
  SpvVersion spvVersion_00;
  string sourceEntryPointName;
  undefined4 uVar2;
  undefined4 uVar3;
  char cVar4;
  int iVar5;
  TParseContextBase *pc;
  long lVar6;
  int i;
  long lVar7;
  char *builtInShaders [2];
  TInputScanner input;
  size_t builtInLengths [2];
  ForbidIncluder includer;
  TScanContext scanContext;
  TPpContext ppContext;
  TIntermediate intermediate;
  undefined8 in_stack_fffffffffffff2e8;
  uint uVar8;
  pointer local_ce8 [2];
  string local_cd8;
  int local_cb8;
  undefined8 local_cb0;
  undefined8 *local_ca8;
  undefined8 local_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined4 local_c88;
  undefined2 local_c80;
  size_type local_c78 [3];
  Includer local_c60;
  long *local_c58 [2];
  long local_c48 [2];
  TScanContext local_c38;
  TPpContext local_be8;
  TIntermediate local_818;
  
  glslang::TIntermediate::TIntermediate(&local_818,language,version,profile);
  uVar8 = spvVersion->spv;
  iVar5 = spvVersion->vulkanGlsl;
  uVar2 = spvVersion->vulkan;
  uVar3 = spvVersion->openGl;
  spvVersion_00.openGl = uVar3;
  spvVersion_00.vulkan = uVar2;
  local_c58[0] = local_c48;
  local_818.source = source;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c58,"");
  spvVersion_00.vulkanGlsl = iVar5;
  spvVersion_00.spv = uVar8;
  spvVersion_00.vulkanRelaxed = spvVersion->vulkanRelaxed;
  spvVersion_00._17_3_ = *(undefined3 *)&spvVersion->field_0x11;
  sourceEntryPointName._M_string_length = in_stack_fffffffffffff2e8;
  sourceEntryPointName._M_dataplus._M_p = (pointer)local_c58;
  sourceEntryPointName.field_2._M_allocated_capacity = (size_type)builtIns;
  sourceEntryPointName.field_2._8_4_ = uVar8;
  sourceEntryPointName.field_2._12_4_ = iVar5;
  pc = CreateParseContext(symbolTable,&local_818,version,profile,source,language,infoSink,
                          spvVersion_00,true,EShMsgDefault,true,sourceEntryPointName);
  if (local_c58[0] != local_c48) {
    operator_delete(local_c58[0],local_c48[0] + 1);
  }
  local_c60._vptr_Includer = (_func_int **)&PTR_includeSystem_00b08540;
  local_cd8._M_dataplus._M_p = (pointer)&local_cd8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cd8,"");
  glslang::TPpContext::TPpContext(&local_be8,pc,&local_cd8,&local_c60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8._M_dataplus._M_p != &local_cd8.field_2) {
    operator_delete(local_cd8._M_dataplus._M_p,local_cd8.field_2._M_allocated_capacity + 1);
  }
  local_c38._vptr_TScanContext = (_func_int **)&PTR__TScanContext_00b08998;
  local_c38.afterType = false;
  local_c38.afterStruct = false;
  local_c38.field = false;
  local_c38.afterBuffer = false;
  pc->scanContext = &local_c38;
  pc->ppContext = &local_be8;
  local_c38.parseContext = pc;
  glslang::TSymbolTable::push(symbolTable);
  local_ce8[0] = (builtIns->_M_dataplus)._M_p;
  local_c78[0] = builtIns->_M_string_length;
  if (local_c78[0] == 0) {
    cVar4 = '\x01';
  }
  else {
    local_cd8._M_dataplus._M_p = (pointer)&PTR__TInputScanner_00b08978;
    local_cd8._M_string_length._0_4_ = 1;
    local_cd8.field_2._M_allocated_capacity = (size_type)local_ce8;
    local_cd8.field_2._8_8_ = local_c78;
    local_cb8 = 0;
    lVar7 = 0;
    local_cb0 = 0;
    local_ca0 = 0;
    local_c80 = 0;
    local_ca8 = (undefined8 *)operator_new__(0x18);
    lVar6 = 8;
    do {
      puVar1 = (undefined8 *)((long)local_ca8 + lVar6 + -8);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined4 *)((long)local_ca8 + lVar6 + 8) = 0;
      *(int *)((long)local_ca8 + lVar6) = (int)lVar7 - (int)local_ca0;
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x18;
    } while (lVar7 < (int)local_cd8._M_string_length);
    *(undefined4 *)((long)local_ca8 + (long)local_cb8 * 0x18 + 0xc) = 1;
    local_c88 = 0;
    uStack_c90 = 1;
    local_c98 = *local_ca8;
    iVar5 = (*(pc->super_TParseVersions)._vptr_TParseVersions[0x3b])(pc,&local_be8,&local_cd8,0);
    cVar4 = (char)iVar5;
    if (cVar4 == '\0') {
      glslang::TInfoSinkBase::message
                (&infoSink->info,EPrefixInternalError,"Unable to parse built-ins");
      printf("Unable to parse built-ins\n%s\n",(infoSink->info).sink._M_dataplus._M_p);
      puts(local_ce8[0]);
    }
    local_cd8._M_dataplus._M_p = (pointer)&PTR__TInputScanner_00b08978;
    if (local_ca8 != (undefined8 *)0x0) {
      operator_delete__(local_ca8);
    }
  }
  glslang::TPpContext::~TPpContext(&local_be8);
  (*(pc->super_TParseVersions)._vptr_TParseVersions[1])(pc);
  glslang::TIntermediate::~TIntermediate(&local_818);
  return (bool)cVar4;
}

Assistant:

bool InitializeSymbolTable(const TString& builtIns, int version, EProfile profile, const SpvVersion& spvVersion, EShLanguage language,
                           EShSource source, TInfoSink& infoSink, TSymbolTable& symbolTable)
{
    TIntermediate intermediate(language, version, profile);

    intermediate.setSource(source);

    std::unique_ptr<TParseContextBase> parseContext(CreateParseContext(symbolTable, intermediate, version, profile, source,
                                                                       language, infoSink, spvVersion, true, EShMsgDefault,
                                                                       true));

    TShader::ForbidIncluder includer;
    TPpContext ppContext(*parseContext, "", includer);
    TScanContext scanContext(*parseContext);
    parseContext->setScanContext(&scanContext);
    parseContext->setPpContext(&ppContext);

    //
    // Push the symbol table to give it an initial scope.  This
    // push should not have a corresponding pop, so that built-ins
    // are preserved, and the test for an empty table fails.
    //

    symbolTable.push();

    const char* builtInShaders[2];
    size_t builtInLengths[2];
    builtInShaders[0] = builtIns.c_str();
    builtInLengths[0] = builtIns.size();

    if (builtInLengths[0] == 0)
        return true;

    TInputScanner input(1, builtInShaders, builtInLengths);
    if (! parseContext->parseShaderStrings(ppContext, input) != 0) {
        infoSink.info.message(EPrefixInternalError, "Unable to parse built-ins");
        printf("Unable to parse built-ins\n%s\n", infoSink.info.c_str());
        printf("%s\n", builtInShaders[0]);

        return false;
    }

    return true;
}